

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  GlobalFederateId GVar3;
  bool bVar4;
  FederateStates FVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  FederateState *this_00;
  uint *puVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  ActionMessage ncmd;
  optional<helics::ActionMessage> local_e0;
  
  iVar2 = (cmd->dest_id).gid;
  if ((iVar2 != 0) && (iVar2 != (this->super_BrokerBase).higher_broker_id.gid)) {
    if (iVar2 == (this->super_BrokerBase).global_broker_id_local.gid) {
      processCommandsForCore(this,cmd);
      return;
    }
    if ((cmd->dest_id).gid == (this->filterFedID)._M_i.gid) {
      ActionMessage::ActionMessage((ActionMessage *)&local_e0,cmd);
      FilterFederate::handleMessage(this->filterFed,(ActionMessage *)&local_e0);
    }
    else {
      GVar3.gid = (cmd->dest_id).gid;
      if (GVar3.gid == (this->translatorFedID)._M_i.gid) {
        ActionMessage::ActionMessage((ActionMessage *)&local_e0,cmd);
        TranslatorFederate::handleMessage(this->translatorFed,(ActionMessage *)&local_e0);
      }
      else {
        bVar4 = isLocal(this,GVar3);
        GVar3.gid = (cmd->dest_id).gid;
        if (!bVar4) {
          p_Var8 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          puVar6 = &parent_route_id;
          if (p_Var8 != (_Base_ptr)0x0) {
            p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = &p_Var1->_M_header;
            do {
              if (GVar3.gid <= (int)p_Var8[1]._M_color) {
                p_Var7 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < GVar3.gid];
            } while (p_Var8 != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var7 != p_Var1) {
              puVar6 = &parent_route_id;
              if ((int)p_Var7[1]._M_color <= GVar3.gid) {
                puVar6 = (uint *)&p_Var7[1].field_0x4;
              }
            }
          }
          uVar9 = (ulong)*puVar6;
          UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
          goto LAB_002f6dd1;
        }
        this_00 = getFederateCore(this,GVar3);
        if (this_00 == (FederateState *)0x0) {
          return;
        }
        FVar5 = FederateState::getState(this_00);
        if ((FVar5 != FINISHED) && (FVar5 = FederateState::getState(this_00), FVar5 != ERRORED)) {
          FederateState::addAction(this_00,cmd);
          return;
        }
        FederateState::processPostTerminationAction(&local_e0,this_00,cmd);
        if (local_e0.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
          routeMessage(this,(ActionMessage *)&local_e0);
        }
        if ((local_e0.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
             super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
             super__Optional_payload_base<helics::ActionMessage>._M_engaged & 1U) == 0) {
          return;
        }
        local_e0.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
        super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
        super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
      }
    }
    ActionMessage::~ActionMessage((ActionMessage *)&local_e0);
    return;
  }
  UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
  uVar9 = 0;
LAB_002f6dd1:
  (*UNRECOVERED_JUMPTABLE)(this,uVar9,cmd);
  return;
}

Assistant:

void CommonCore::routeMessage(const ActionMessage& cmd)
{
    if ((cmd.dest_id == parent_broker_id) || (cmd.dest_id == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (cmd.dest_id == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (cmd.dest_id == filterFedID) {
        auto ncmd{cmd};
        filterFed->handleMessage(ncmd);
    } else if (cmd.dest_id == translatorFedID) {
        auto ncmd{cmd};
        translatorFed->handleMessage(ncmd);
    } else if (isLocal(cmd.dest_id)) {
        auto* fed = getFederateCore(cmd.dest_id);
        if (fed != nullptr) {
            if ((fed->getState() != FederateStates::FINISHED) &&
                (fed->getState() != FederateStates::ERRORED)) {
                fed->addAction(cmd);
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(cmd.dest_id);
        transmit(route, cmd);
    }
}